

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

ULONGLONG PAL__wcstoui64(char16_t *nptr,char16_t **endptr,int base)

{
  int iVar1;
  DWORD DVar2;
  char *lpMultiByteStr;
  ulonglong uVar3;
  char *local_38;
  char *s_endptr;
  
  local_38 = (char *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = WideCharToMultiByte(0,0,nptr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar1 == 0) {
      DVar2 = GetLastError();
      lpMultiByteStr = (char *)0x0;
      fprintf(_stderr,"] %s %s:%d","PAL__wcstoui64",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
              ,0x343);
      fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
      SetLastError(0x57);
      uVar3 = 0;
    }
    else {
      lpMultiByteStr = (char *)PAL_malloc((long)iVar1);
      if (lpMultiByteStr == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011dc4a;
        SetLastError(8);
        lpMultiByteStr = (char *)0x0;
        uVar3 = 0;
      }
      else {
        iVar1 = WideCharToMultiByte(0,0,nptr,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar1 == 0) {
          DVar2 = GetLastError();
          uVar3 = 0;
          fprintf(_stderr,"] %s %s:%d","PAL__wcstoui64",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                  ,0x354);
          fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
          SetLastError(0x57);
        }
        else {
          uVar3 = strtoull(lpMultiByteStr,&local_38,base);
          if (endptr != (char16_t **)0x0) {
            *endptr = nptr + ((int)local_38 - (int)lpMultiByteStr);
          }
        }
      }
    }
    PAL_free(lpMultiByteStr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return uVar3;
    }
  }
LAB_0011dc4a:
  abort();
}

Assistant:

ULONGLONG
__cdecl
PAL__wcstoui64(
        const char16_t *nptr,
        char16_t **endptr,
        int base)
{
    char *s_nptr = 0;
    char *s_endptr = 0;
    unsigned long long res;
    int size;
    DWORD dwLastError = 0;

    PERF_ENTRY(wcstoul);
    ENTRY("_wcstoui64 (nptr=%p (%S), endptr=%p, base=%d)\n", nptr?nptr:W16_NULLSTRING, nptr?nptr:W16_NULLSTRING,
          endptr, base);

    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, NULL, 0, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL__wcstoui64Exit;
    }
    s_nptr = (char *)PAL_malloc(size);
    if (!s_nptr)
    {
        ERROR("PAL_malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        res = 0;
        goto PAL__wcstoui64Exit;
    }
    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, s_nptr, size, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL__wcstoui64Exit;
    }

    res = strtoull(s_nptr, &s_endptr, base);

    /* only ASCII characters will be accepted by strtoull, and those always get
       mapped to single-byte characters, so the first rejected character will
       have the same index in the multibyte and widechar strings */
    if( endptr )
    {
        size = s_endptr - s_nptr;
        *endptr = (char16_t *)&nptr[size];
    }

PAL__wcstoui64Exit:
    PAL_free(s_nptr);
    LOGEXIT("_wcstoui64 returning unsigned long long %llu\n", res);
    PERF_EXIT(_wcstoui64);

    return res;
}